

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmerr.cpp
# Opt level: O0

size_t err_throw_v(err_id_t error_code,int param_count,__va_list_tag *va,CVmException *exc)

{
  uint uVar1;
  undefined4 uVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  undefined4 *in_RCX;
  uint *in_RDX;
  int in_ESI;
  undefined4 in_EDI;
  long *in_FS_OFFSET;
  size_t slen;
  char *sptr;
  ulong ulval;
  int ival;
  err_param_type typ;
  int i;
  char *strspace;
  CVmExcParam *param;
  size_t siz;
  undefined8 *in_stack_fffffffffffffe90;
  uint *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea4;
  undefined8 *local_150;
  long *local_138;
  undefined8 *local_108;
  long *local_f0;
  undefined8 *local_a8;
  undefined4 *local_90;
  undefined4 *local_70;
  int local_34;
  undefined4 *local_28;
  size_t local_20;
  
  local_20 = (long)in_ESI * 0x18 + 0x20;
  local_28 = (undefined4 *)0x0;
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = in_EDI;
    in_RCX[6] = in_ESI;
    in_RCX[1] = 0;
    *(undefined8 *)(in_RCX + 2) = 0;
    *(undefined8 *)(in_RCX + 4) = 0;
    if ((**(uint **)(*in_FS_OFFSET + -8) & 0x4003) != 0) {
      free(*(void **)(*(long *)(*in_FS_OFFSET + -8) + 0x10));
    }
    *(undefined4 **)(*(long *)(*in_FS_OFFSET + -8) + 0x10) = in_RCX;
    local_28 = in_RCX + 8;
  }
  for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
    uVar1 = *in_RDX;
    if (uVar1 < 0x29) {
      local_70 = (undefined4 *)((long)(int)uVar1 + *(long *)(in_RDX + 4));
      *in_RDX = uVar1 + 8;
    }
    else {
      local_70 = *(undefined4 **)(in_RDX + 2);
      *(undefined4 **)(in_RDX + 2) = local_70 + 2;
    }
    uVar2 = *local_70;
    if (in_RCX != (undefined4 *)0x0) {
      *local_28 = uVar2;
    }
    switch(uVar2) {
    case 0:
      uVar1 = *in_RDX;
      if (uVar1 < 0x29) {
        local_90 = (undefined4 *)((long)(int)uVar1 + *(long *)(in_RDX + 4));
        *in_RDX = uVar1 + 8;
      }
      else {
        local_90 = *(undefined4 **)(in_RDX + 2);
        *(undefined4 **)(in_RDX + 2) = local_90 + 2;
      }
      if (in_RCX != (undefined4 *)0x0) {
        local_28[2] = *local_90;
      }
      break;
    case 1:
      uVar1 = *in_RDX;
      if (uVar1 < 0x29) {
        local_a8 = (undefined8 *)((long)(int)uVar1 + *(long *)(in_RDX + 4));
        *in_RDX = uVar1 + 8;
      }
      else {
        local_a8 = *(undefined8 **)(in_RDX + 2);
        *(undefined8 **)(in_RDX + 2) = local_a8 + 1;
      }
      if (in_RCX != (undefined4 *)0x0) {
        *(undefined8 *)(local_28 + 2) = *local_a8;
      }
      break;
    case 2:
      if (*in_RDX < 0x29) {
        *in_RDX = *in_RDX + 8;
      }
      else {
        *(long *)(in_RDX + 2) = *(long *)(in_RDX + 2) + 8;
      }
      sVar3 = get_strlen((textchar_t *)0x2deee6);
      local_20 = sVar3 + 1 + local_20;
      if (in_RCX != (undefined4 *)0x0) {
        pcVar5 = err_store_str((char **)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                ),(char *)in_stack_fffffffffffffe98,
                               (size_t)in_stack_fffffffffffffe90);
        *(char **)(local_28 + 2) = pcVar5;
      }
      break;
    case 3:
      uVar1 = *in_RDX;
      if (uVar1 < 0x29) {
        local_108 = (undefined8 *)((long)(int)uVar1 + *(long *)(in_RDX + 4));
        *in_RDX = uVar1 + 8;
      }
      else {
        local_108 = *(undefined8 **)(in_RDX + 2);
        *(undefined8 **)(in_RDX + 2) = local_108 + 1;
      }
      sVar4 = strlen((char *)*local_108);
      local_20 = sVar4 + 1 + local_20;
      if (in_RCX != (undefined4 *)0x0) {
        pcVar5 = err_store_str((char **)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                ),(char *)in_stack_fffffffffffffe98,
                               (size_t)in_stack_fffffffffffffe90);
        *(char **)(local_28 + 2) = pcVar5;
      }
      break;
    case 4:
      if (*in_RDX < 0x29) {
        *in_RDX = *in_RDX + 8;
      }
      else {
        *(long *)(in_RDX + 2) = *(long *)(in_RDX + 2) + 8;
      }
      uVar1 = *in_RDX;
      if (uVar1 < 0x29) {
        local_f0 = (long *)((long)(int)uVar1 + *(long *)(in_RDX + 4));
        *in_RDX = uVar1 + 8;
      }
      else {
        local_f0 = *(long **)(in_RDX + 2);
        *(long **)(in_RDX + 2) = local_f0 + 1;
      }
      local_20 = *local_f0 + 1 + local_20;
      if (in_RCX != (undefined4 *)0x0) {
        *local_28 = 2;
        pcVar5 = err_store_str((char **)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                ),(char *)in_stack_fffffffffffffe98,
                               (size_t)in_stack_fffffffffffffe90);
        *(char **)(local_28 + 2) = pcVar5;
      }
      break;
    case 5:
      if (*in_RDX < 0x29) {
        *in_RDX = *in_RDX + 8;
      }
      else {
        *(long *)(in_RDX + 2) = *(long *)(in_RDX + 2) + 8;
      }
      uVar1 = *in_RDX;
      if (uVar1 < 0x29) {
        local_138 = (long *)((long)(int)uVar1 + *(long *)(in_RDX + 4));
        *in_RDX = uVar1 + 8;
      }
      else {
        local_138 = *(long **)(in_RDX + 2);
        *(long **)(in_RDX + 2) = local_138 + 1;
      }
      local_20 = *local_138 + 1 + local_20;
      if (in_RCX != (undefined4 *)0x0) {
        pcVar5 = err_store_str((char **)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                ),(char *)in_stack_fffffffffffffe98,
                               (size_t)in_stack_fffffffffffffe90);
        *(char **)(local_28 + 2) = pcVar5;
        *local_28 = 3;
      }
      break;
    case 6:
      in_stack_fffffffffffffea4 = *in_RDX;
      if (in_stack_fffffffffffffea4 < 0x29) {
        in_stack_fffffffffffffe90 =
             (undefined8 *)((long)(int)in_stack_fffffffffffffea4 + *(long *)(in_RDX + 4));
        *in_RDX = in_stack_fffffffffffffea4 + 8;
      }
      else {
        in_stack_fffffffffffffe90 = *(undefined8 **)(in_RDX + 2);
        *(undefined8 **)(in_RDX + 2) = in_stack_fffffffffffffe90 + 1;
      }
      pcVar5 = (char *)*in_stack_fffffffffffffe90;
      in_stack_fffffffffffffe98 = in_RDX;
      sVar4 = strlen(pcVar5);
      local_20 = sVar4 + 1 + local_20;
      if (in_RCX != (undefined4 *)0x0) {
        strlen(pcVar5);
        pcVar5 = err_store_str((char **)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                ),(char *)in_stack_fffffffffffffe98,
                               (size_t)in_stack_fffffffffffffe90);
        *(char **)(in_RCX + 2) = pcVar5;
      }
      break;
    case 7:
      uVar1 = *in_RDX;
      if (uVar1 < 0x29) {
        local_150 = (undefined8 *)((long)(int)uVar1 + *(long *)(in_RDX + 4));
        *in_RDX = uVar1 + 8;
      }
      else {
        local_150 = *(undefined8 **)(in_RDX + 2);
        *(undefined8 **)(in_RDX + 2) = local_150 + 1;
      }
      pcVar5 = (char *)*local_150;
      sVar4 = strlen(pcVar5);
      local_20 = sVar4 + 1 + local_20;
      if (in_RCX != (undefined4 *)0x0) {
        strlen(pcVar5);
        pcVar5 = err_store_str((char **)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                ),(char *)in_stack_fffffffffffffe98,
                               (size_t)in_stack_fffffffffffffe90);
        *(char **)(in_RCX + 4) = pcVar5;
      }
      break;
    case 8:
      if (in_RCX != (undefined4 *)0x0) {
        in_RCX[1] = 1;
      }
    }
    local_28 = local_28 + 6;
  }
  if (in_RCX == (undefined4 *)0x0) {
    return local_20;
  }
  err_throw_current();
}

Assistant:

static size_t err_throw_v(err_id_t error_code, int param_count, va_list va,
                          CVmException *exc)
{
    /*
     *   Assert that the size of the err_param_type enum is no larger than
     *   the size of the native 'int' type.  Since this routine is called
     *   with a varargs list, and since ANSI requires compilers to promote
     *   any enum type smaller than int to int when passing to a varargs
     *   function, we must retrieve our err_param_type arguments (via the
     *   va_arg() macro) with type 'int' rather than type 'enum
     *   err_param_type'.
     *   
     *   The promotion to int is mandatory, so retrieving our values as
     *   'int' values is the correct, portable thing to do; the only
     *   potential problem is that our enum type could be defined to be
     *   *larger* than int, in which case the compiler would pass it to us
     *   as the larger type, not int, and our retrieval would be incorrect.
     *   The only way a compiler would be allowed to do this is if our enum
     *   type actually required a type larger than unsigned int (in other
     *   words, we had enum values higher than the largest unsigned int
     *   value for the local platform).  This is extremely unlikely, but
     *   we'll assert our assumption here to ensure that the problem is
     *   readily apparent should it ever occur.  
     */
    assert(sizeof(err_param_type) <= sizeof(int));

    /* 
     *   Figure out how much space we need.  Start with the size of the base
     *   CVmException class, since we always need a CVmException structure.
     *   This structure has space for one argument descriptor built in, so
     *   subtract that off from our base size, since we'll add in space for
     *   the argument descriptors separately.  
     */
    size_t siz = sizeof(CVmException) - sizeof(CVmExcParam);

    /* 
     *   Add in space the parameter descriptors.  We need one CVmExcParam
     *   structure to describe each parameter.  
     */
    siz += param_count * sizeof(CVmExcParam);

    /* fill in our base structure, if allocated */
    CVmExcParam *param = 0;
    char *strspace = 0;
    if (exc != 0)
    {
        /* set the error code and parameter count */
        exc->error_code_ = error_code;
        exc->param_count_ = param_count;

        /* presume this is not an out-of-date version error */
        exc->version_flag_ = FALSE;
        exc->metaclass_ = 0;
        exc->funcset_ = 0;

        /*
         *   If the current stack frame is already handling an error, delete
         *   the current frame's exception object, since the current frame
         *   will no longer be accessible after this throw.  
         */
        if (os_tls_get(err_frame_t *, G_err_frame)->state_
            & (ERR_STATE_EXCEPTION | ERR_STATE_CAUGHT | ERR_STATE_RETHROWN))
            t3free(os_tls_get(err_frame_t *, G_err_frame)->exc_);
        
        /* this is now the current exception */
        os_tls_get(err_frame_t *, G_err_frame)->exc_ = exc;

        /* start at the first parameter slot */
        param = exc->params_;

        /* 
         *   store strings in the allocated space after the base struct and
         *   (varying-size) parameter array 
         */
        strspace = (char *)&exc->params_[param_count];
    }

    /* 
     *   We now have our base exception structure, with enough space for the
     *   parameter descriptors, but we still need to store the parameter
     *   values themselves.
     */
    for (int i = 0 ; i < param_count ; ++i, ++param)
    {
        /* get the type indicator, and store it in the descriptor */
        err_param_type typ = (err_param_type)va_arg(va, int);
        
        /* store the type */
        if (exc != 0)
            param->type_ = typ;

        /* store the argument's value */
        int ival;
        ulong ulval;
        const char *sptr;
        size_t slen;
        switch(typ)
        {
        case ERR_TYPE_INT:
            /* store the integer */
            ival = va_arg(va, int);
            if (exc != 0)
                param->val_.intval_ = ival;
            break;

        case ERR_TYPE_ULONG:
            /* store the unsigned long */
            ulval = va_arg(va, unsigned long);
            if (exc != 0)
                param->val_.ulong_ = ulval;
            break;

        case ERR_TYPE_TEXTCHAR:
            /* 
             *   It's a (textchar_t *) string, null-terminated.  Get the
             *   string pointer and calculate its length. 
             */
            sptr = va_arg(va, textchar_t *);
            slen = get_strlen(sptr);

            /* count the string space needed */
            siz += slen + 1;

            /* store it in parameter memory */
            if (exc != 0)
                param->val_.strval_ = err_store_str(strspace, sptr, slen);
            break;

        case ERR_TYPE_TEXTCHAR_LEN:
            /* 
             *   It's a (textchar_t *) string with an explicit length given
             *   as a separate size_t parameter. 
             */
            sptr = va_arg(va, textchar_t *);
            slen = va_arg(va, size_t);

            /* count the string space */
            siz += slen + 1;

            /* store it in parameter memory */
            if (exc != 0)
            {
                param->type_ = ERR_TYPE_TEXTCHAR;
                param->val_.strval_ = err_store_str(strspace, sptr, slen);
            }

            break;

        case ERR_TYPE_CHAR:
            /* it's a (char *) string, null-terminated */
            sptr = va_arg(va, char *);
            slen = strlen(sptr);

            /* count the string space */
            siz += slen + 1;

            /* store it */
            if (exc != 0)
                param->val_.charval_ = err_store_str(strspace, sptr, slen);
            break;

        case ERR_TYPE_CHAR_LEN:
            /* it's a (char *) string with an explicit size_t size */
            sptr = va_arg(va, char *);
            slen = va_arg(va, size_t);

            /* count the string space */
            siz += slen + 1;

            /* store it */
            if (exc != 0)
            {
                param->val_.charval_ = err_store_str(strspace, sptr, slen);
                param->type_ = ERR_TYPE_CHAR;
            }
            break;

        case ERR_TYPE_FUNCSET:
            /* 
             *   It's a char* string with a function set ID.  These are not
             *   stored in the parameters, but go in the funcset_ slot in the
             *   exception object. 
             */
            sptr = va_arg(va, char *);
            siz += strlen(sptr) + 1;
            if (exc != 0)
                exc->funcset_ = err_store_str(strspace, sptr, strlen(sptr));
            break;

        case ERR_TYPE_METACLASS:
            /* 
             *   It's a char* string with a metaclass ID.  These are not
             *   stored in the parameters, but go in the metaclass_ slot in
             *   the exception object.  
             */
            sptr = va_arg(va, char *);
            siz += strlen(sptr) + 1;
            if (exc != 0)
                exc->metaclass_ = err_store_str(strspace, sptr, strlen(sptr));
            break;

        case ERR_TYPE_VERSION_FLAG:
            /* 
             *   This parameter is a flag indicating that the error is due to
             *   an out-of-date interpreter build.  This has no parameter
             *   data; we simply set the flag in the exception to indicate
             *   the version error type.  
             */
            if (exc != 0)
                exc->version_flag_ = TRUE;
            break;
        }
    }

    /* 
     *   if we have an exception, throw it; if not, we're doing a dry run to
     *   compute the exception object size, so simply return the computed
     *   size 
     */
    if (exc != 0)
    {
        /* throw the exception object that we just populated */
        err_throw_current();
        VMERR_AFTER_ERR_THROW(return 0;)
    }
    else
    {
        /* we're only computing the size on this pass */
        return siz;
    }
}